

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeCPSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  DecodeStatus local_44;
  DecodeStatus S;
  uint mode;
  uint iflags;
  uint M;
  uint imod;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,0x12,2);
  uVar2 = fieldFromInstruction_4(Insn,0x11,1);
  uVar3 = fieldFromInstruction_4(Insn,6,3);
  uVar4 = fieldFromInstruction_4(Insn,0,5);
  local_44 = MCDisassembler_Success;
  uVar5 = fieldFromInstruction_4(Insn,5,1);
  if (((uVar5 == 0) && (uVar5 = fieldFromInstruction_4(Insn,0x10,1), uVar5 == 0)) &&
     (uVar5 = fieldFromInstruction_4(Insn,0x14,8), uVar5 == 0x10)) {
    if (uVar1 == 1) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      if ((uVar1 == 0) || (uVar2 == 0)) {
        if ((uVar1 == 0) || (uVar2 != 0)) {
          if ((uVar1 == 0) && (uVar2 != 0)) {
            MCInst_setOpcode(Inst,0x56);
            MCOperand_CreateImm0(Inst,(ulong)uVar4);
            if (uVar3 != 0) {
              local_44 = MCDisassembler_SoftFail;
            }
          }
          else {
            MCInst_setOpcode(Inst,0x56);
            MCOperand_CreateImm0(Inst,(ulong)uVar4);
            local_44 = MCDisassembler_SoftFail;
          }
        }
        else {
          MCInst_setOpcode(Inst,0x57);
          MCOperand_CreateImm0(Inst,(ulong)uVar1);
          MCOperand_CreateImm0(Inst,(ulong)uVar3);
          if (uVar4 != 0) {
            local_44 = MCDisassembler_SoftFail;
          }
        }
      }
      else {
        MCInst_setOpcode(Inst,0x58);
        MCOperand_CreateImm0(Inst,(ulong)uVar1);
        MCOperand_CreateImm0(Inst,(ulong)uVar3);
        MCOperand_CreateImm0(Inst,(ulong)uVar4);
      }
      Inst_local._4_4_ = local_44;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeCPSInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned imod = fieldFromInstruction_4(Insn, 18, 2);
	unsigned M = fieldFromInstruction_4(Insn, 17, 1);
	unsigned iflags = fieldFromInstruction_4(Insn, 6, 3);
	unsigned mode = fieldFromInstruction_4(Insn, 0, 5);

	DecodeStatus S = MCDisassembler_Success;

	// This decoder is called from multiple location that do not check
	// the full encoding is valid before they do.
	if (fieldFromInstruction_4(Insn, 5, 1) != 0 ||
			fieldFromInstruction_4(Insn, 16, 1) != 0 ||
			fieldFromInstruction_4(Insn, 20, 8) != 0x10)
		return MCDisassembler_Fail;

	// imod == '01' --> UNPREDICTABLE
	// NOTE: Even though this is technically UNPREDICTABLE, we choose to
	// return failure here.  The '01' imod value is unprintable, so there's
	// nothing useful we could do even if we returned UNPREDICTABLE.

	if (imod == 1) return MCDisassembler_Fail;

	if (imod && M) {
		MCInst_setOpcode(Inst, ARM_CPS3p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		MCOperand_CreateImm0(Inst, mode);
	} else if (imod && !M) {
		MCInst_setOpcode(Inst, ARM_CPS2p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		if (mode) S = MCDisassembler_SoftFail;
	} else if (!imod && M) {
		MCInst_setOpcode(Inst, ARM_CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		if (iflags) S = MCDisassembler_SoftFail;
	} else {
		// imod == '00' && M == '0' --> UNPREDICTABLE
		MCInst_setOpcode(Inst, ARM_CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		S = MCDisassembler_SoftFail;
	}

	return S;
}